

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

unique_ptr<Catch::ColourImpl> __thiscall
Catch::makeColourImpl(Catch *this,ColourMode implSelection,IStream *stream)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000031;
  undefined **ppuVar5;
  ReusableStringStream RStack_58;
  string local_48;
  
  ppuVar5 = &PTR__ColourImpl_00323c40;
  iVar1 = (int)CONCAT71(in_register_00000031,implSelection);
  if (iVar1 == 0) {
    iVar1 = (*stream->_vptr_IStream[3])(stream);
    if ((char)iVar1 != '\0') {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      iVar2 = isatty(1);
      *piVar3 = iVar1;
      if (iVar2 != 0) goto LAB_00143a16;
    }
  }
  else {
    if (iVar1 == 1) goto LAB_00143a16;
    if (iVar1 != 3) {
      ReusableStringStream::ReusableStringStream(&RStack_58);
      std::__ostream_insert<char,std::char_traits<char>>
                (RStack_58.m_oss,"Could not create colour impl for selection ",0x2b);
      std::ostream::operator<<(RStack_58.m_oss,(uint)implSelection);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_48);
    }
  }
  ppuVar5 = &PTR__ColourImpl_00323c80;
LAB_00143a16:
  puVar4 = (undefined8 *)operator_new(0x10);
  puVar4[1] = stream;
  *puVar4 = ppuVar5;
  *(undefined8 **)this = puVar4;
  return (unique_ptr<Catch::ColourImpl>)(ColourImpl *)this;
}

Assistant:

Detail::unique_ptr<ColourImpl> makeColourImpl( ColourMode implSelection,
                                                   IStream* stream ) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
        if ( implSelection == ColourMode::Win32 ) {
            return Detail::make_unique<Win32ColourImpl>( stream );
        }
#endif
        if ( implSelection == ColourMode::ANSI ) {
            return Detail::make_unique<ANSIColourImpl>( stream );
        }
        if ( implSelection == ColourMode::None ) {
            return Detail::make_unique<NoColourImpl>( stream );
        }

        if ( implSelection == ColourMode::PlatformDefault) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
            if ( Win32ColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<Win32ColourImpl>( stream );
            }
#endif
            if ( ANSIColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<ANSIColourImpl>( stream );
            }
            return Detail::make_unique<NoColourImpl>( stream );
        }

        CATCH_ERROR( "Could not create colour impl for selection " << static_cast<int>(implSelection) );
    }